

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

TestCase * TestCharReaderFailIfExtraTestcommentAfterArray::factory(void)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x10);
  this->_vptr_TestCase = (_func_int **)0x0;
  this->result_ = (TestResult *)0x0;
  JsonTest::TestCase::TestCase(this);
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_001616c8;
  return this;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterArray) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "[ \"property\" , \"value\" ] //trailing\n//comment\n";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL("value", root[1u]);
  delete reader;
}